

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_4::Validator::OnMemoryCopyExpr(Validator *this,MemoryCopyExpr *expr)

{
  Result RVar1;
  Var local_c0;
  Var local_78;
  
  Var::Var(&local_78,&expr->destmemidx);
  Var::Var(&local_c0,&expr->srcmemidx);
  RVar1 = SharedValidator::OnMemoryCopy
                    (&this->validator_,&(expr->super_ExprMixin<(wabt::ExprType)28>).super_Expr.loc,
                     &local_78,&local_c0);
  (this->result_).enum_ = (uint)(RVar1.enum_ == Error || (this->result_).enum_ == Error);
  Var::~Var(&local_c0);
  Var::~Var(&local_78);
  return (Result)Ok;
}

Assistant:

Result Validator::OnMemoryCopyExpr(MemoryCopyExpr* expr) {
  result_ |=
      validator_.OnMemoryCopy(expr->loc, expr->destmemidx, expr->srcmemidx);
  return Result::Ok;
}